

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O3

int main(int argc,char **argv)

{
  _Bool _Var1;
  byte *pbVar2;
  size_t length;
  char *__s;
  char filtered_string [1024];
  char string [1024];
  byte local_818 [1024];
  byte local_418;
  byte local_417 [1031];
  
  length = 0;
  printf("Give me a string and I will tell you if it is a palindrome: ");
  fgets((char *)&local_418,0x400,_stdin);
  if (local_418 != 0) {
    pbVar2 = local_417;
    length = 0;
    do {
      if ((byte)((local_418 & 0xdf) + 0xbf) < 0x1a) {
        local_818[length] = local_418;
        length = length + 1;
      }
      local_418 = *pbVar2;
      pbVar2 = pbVar2 + 1;
    } while (local_418 != 0);
  }
  local_818[length] = 0;
  _Var1 = is_palindrome((char *)local_818,length);
  __s = "It isn\'t a palindrome.";
  if (_Var1) {
    __s = "It is indeed a palindrome.";
  }
  puts(__s);
  return 0;
}

Assistant:

int main(int argc, char** argv) {
  char string[STR_LEN];
  char filtered_string[STR_LEN];

  printf("Give me a string and I will tell you if it is a palindrome: ");
  fgets(string, STR_LEN, stdin);

  size_t length = filter_letters(string, filtered_string);

  if (is_palindrome(filtered_string, length)) {
    printf("It is indeed a palindrome.\n");
  } else {
    printf("It isn't a palindrome.\n");
  }

  return 0;
}